

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatDecimal
          (LocalizedNumberFormatter *this,StringPiece value,UErrorCode *status)

{
  UFormattedNumberData *this_00;
  char *pcVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  UFormattedNumberData *p;
  UErrorCode *in_R8;
  UErrorCode UVar2;
  FormattedNumber FVar3;
  StringPiece n;
  
  pcVar1 = value._8_8_;
  if (*in_R8 < U_ILLEGAL_ARGUMENT_ERROR) {
    this_00 = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,(size_t)value.ptr_);
    if (this_00 == (UFormattedNumberData *)0x0) {
      *in_R8 = U_MEMORY_ALLOCATION_ERROR;
      UVar2 = U_MEMORY_ALLOCATION_ERROR;
      pcVar1 = extraout_RDX;
    }
    else {
      UVar2 = U_ZERO_ERROR;
      memset(this_00,0,0x158);
      impl::UFormattedNumberData::UFormattedNumberData(this_00);
      n._8_8_ = (ulong)status & 0xffffffff;
      n.ptr_ = pcVar1;
      impl::DecimalQuantity::setToDecNumber(&this_00->quantity,n,in_R8);
      p = this_00;
      formatImpl((LocalizedNumberFormatter *)value.ptr_,this_00,in_R8);
      pcVar1 = extraout_RDX_00;
      if (*in_R8 < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_00257cc9;
      impl::UFormattedNumberData::~UFormattedNumberData(this_00);
      UMemory::operator_delete((UMemory *)this_00,p);
      UVar2 = *in_R8;
      pcVar1 = extraout_RDX_01;
    }
  }
  else {
    UVar2 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  this_00 = (UFormattedNumberData *)0x0;
LAB_00257cc9:
  *(UFormattedNumberData **)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros =
       this_00;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.errorCode = UVar2;
  FVar3._8_8_ = pcVar1;
  FVar3.fResults = (UFormattedNumberData *)this;
  return FVar3;
}

Assistant:

FormattedNumber LocalizedNumberFormatter::formatDecimal(StringPiece value, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity.setToDecNumber(value, status);
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}